

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimagescale_sse4.cpp
# Opt level: O1

void qt_qimageScaleAARGBA_up_x_down_y_sse4<false>
               (QImageScaleInfo *isi,uint *dest,int dw,int dh,int dow,int sow)

{
  uint *puVar1;
  uint uVar2;
  int *piVar3;
  uint *puVar4;
  uint *puVar5;
  int *piVar6;
  int *piVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  char cVar16;
  uint uVar17;
  QThreadPool *pQVar18;
  undefined8 *puVar19;
  undefined8 *puVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  uint *puVar25;
  int iVar26;
  int iVar27;
  uint *puVar28;
  long in_FS_OFFSET;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar36;
  undefined1 in_XMM3 [16];
  undefined1 auVar35 [16];
  int iVar37;
  int iVar38;
  undefined1 in_XMM4 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM6 [16];
  anon_class_72_9_523e8b3d scaleSection;
  __m128i v256;
  int *yapoints;
  int *xapoints;
  int *xpoints;
  uint **ypoints;
  ulong local_118;
  int **local_d8;
  uint **ppuStack_d0;
  int *local_c8;
  int *piStack_c0;
  uint ***local_b8;
  int **ppiStack_b0;
  int *local_a8;
  int **ppiStack_a0;
  int *local_98;
  int local_88 [4];
  int *local_78;
  int *local_70;
  int *local_68;
  uint **local_60;
  int local_54;
  int local_50;
  int local_4c;
  uint *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppuStack_d0 = &local_48;
  piStack_c0 = &local_4c;
  local_c8 = &local_50;
  local_a8 = &local_54;
  local_60 = isi->ypoints;
  local_b8 = &local_60;
  local_68 = isi->xpoints;
  ppiStack_b0 = &local_68;
  local_70 = isi->xapoints;
  ppiStack_a0 = &local_70;
  local_78 = isi->yapoints;
  local_d8 = &local_78;
  local_98 = local_88;
  local_88[0] = 0x100;
  local_88[1] = 0x100;
  local_88[2] = 0x100;
  local_88[3] = 0x100;
  lVar21 = (long)isi->sw * (long)isi->sh;
  lVar22 = lVar21 + 0xffff;
  if (-1 < lVar21) {
    lVar22 = lVar21;
  }
  iVar23 = (int)((ulong)lVar22 >> 0x10);
  if (dh <= iVar23) {
    iVar23 = dh;
  }
  local_54 = sow;
  local_50 = dow;
  local_4c = dw;
  local_48 = dest;
  pQVar18 = QGuiApplicationPrivate::qtGuiThreadPool();
  if ((pQVar18 != (QThreadPool *)0x0) && (1 < iVar23)) {
    QThread::currentThread();
    cVar16 = QThreadPool::contains((QThread *)pQVar18);
    if (cVar16 == '\0') {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar27 = 0;
      QSemaphore::QSemaphore((QSemaphore *)&local_40,0);
      do {
        iVar26 = (dh - iVar27) / iVar23;
        puVar19 = (undefined8 *)operator_new(0x18);
        *(undefined1 *)(puVar19 + 1) = 1;
        *puVar19 = QFactoryLoader::keyMap;
        puVar20 = (undefined8 *)operator_new(0x20);
        *puVar20 = QRunnable::QGenericRunnable::
                   Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qimagescale_sse4.cpp:34:31)>
                   ::impl;
        *(int *)(puVar20 + 1) = iVar27;
        *(int *)((long)puVar20 + 0xc) = iVar26;
        puVar20[2] = &local_d8;
        puVar20[3] = &local_40;
        puVar19[2] = puVar20;
        QThreadPool::start((QRunnable *)pQVar18,(int)puVar19);
        iVar27 = iVar27 + iVar26;
        iVar23 = iVar23 + -1;
      } while (iVar23 != 0);
      QSemaphore::acquire((int)(QSemaphore *)&local_40);
      QSemaphore::~QSemaphore((QSemaphore *)&local_40);
      goto LAB_005baaaa;
    }
  }
  if (0 < dh) {
    piVar3 = *local_d8;
    puVar4 = *ppuStack_d0;
    local_118 = 0;
    do {
      if (0 < *piStack_c0) {
        uVar2 = piVar3[local_118];
        uVar17 = uVar2 & 0xffff;
        iVar23 = (int)uVar2 >> 0x10;
        auVar29._4_4_ = iVar23;
        auVar29._0_4_ = iVar23;
        auVar29._8_4_ = iVar23;
        auVar29._12_4_ = iVar23;
        auVar30._0_8_ = CONCAT44(uVar2,uVar2) & 0xffff0000ffff;
        auVar30._8_4_ = uVar17;
        auVar30._12_4_ = uVar17;
        puVar28 = puVar4 + (long)*local_c8 * local_118;
        puVar5 = (*local_b8)[local_118];
        piVar6 = *ppiStack_b0;
        piVar7 = *ppiStack_a0;
        lVar22 = 0;
        do {
          puVar1 = puVar5 + piVar6[lVar22];
          iVar27 = *local_a8;
          auVar35 = pmovzxbd(in_XMM3,*puVar1);
          in_XMM3 = pmulld(auVar35,auVar30);
          iVar26 = 0x4000 - uVar17;
          puVar25 = puVar1;
          while( true ) {
            iVar24 = in_XMM3._4_4_;
            iVar36 = in_XMM3._8_4_;
            iVar37 = in_XMM3._12_4_;
            if (iVar26 <= iVar23) break;
            auVar35 = pmovzxbd(in_XMM2,puVar25[iVar27]);
            puVar25 = puVar25 + iVar27;
            in_XMM2 = pmaddwd(auVar35,auVar29);
            in_XMM3._0_4_ = in_XMM3._0_4_ + in_XMM2._0_4_;
            in_XMM3._4_4_ = iVar24 + in_XMM2._4_4_;
            in_XMM3._8_4_ = iVar36 + in_XMM2._8_4_;
            in_XMM3._12_4_ = iVar37 + in_XMM2._12_4_;
            iVar26 = iVar26 - iVar23;
          }
          in_XMM4 = pmovzxbd(in_XMM4,puVar25[iVar27]);
          auVar35._4_4_ = iVar26;
          auVar35._0_4_ = iVar26;
          auVar35._8_4_ = iVar26;
          auVar35._12_4_ = iVar26;
          auVar35 = pmulld(auVar35,in_XMM4);
          auVar31._0_4_ = auVar35._0_4_ + in_XMM3._0_4_;
          auVar31._4_4_ = auVar35._4_4_ + iVar24;
          auVar31._8_4_ = auVar35._8_4_ + iVar36;
          auVar31._12_4_ = auVar35._12_4_ + iVar37;
          iVar26 = piVar7[lVar22];
          if (0 < iVar26) {
            puVar25 = puVar1 + 1;
            auVar35 = pmovzxbd(in_XMM3,puVar1[1]);
            in_XMM3 = pmulld(auVar35,auVar30);
            iVar24 = 0x4000 - uVar17;
            while( true ) {
              iVar36 = in_XMM3._4_4_;
              iVar37 = in_XMM3._8_4_;
              iVar38 = in_XMM3._12_4_;
              if (iVar24 <= iVar23) break;
              auVar35 = pmovzxbd(in_XMM4,puVar25[iVar27]);
              puVar25 = puVar25 + iVar27;
              in_XMM4 = pmaddwd(auVar35,auVar29);
              in_XMM3._0_4_ = in_XMM3._0_4_ + in_XMM4._0_4_;
              in_XMM3._4_4_ = iVar36 + in_XMM4._4_4_;
              in_XMM3._8_4_ = iVar37 + in_XMM4._8_4_;
              in_XMM3._12_4_ = iVar38 + in_XMM4._12_4_;
              iVar24 = iVar24 - iVar23;
            }
            in_XMM4._4_4_ = iVar26;
            in_XMM4._0_4_ = iVar26;
            in_XMM4._8_4_ = iVar26;
            in_XMM4._12_4_ = iVar26;
            auVar39._0_4_ = *local_98 - iVar26;
            auVar39._4_4_ = local_98[1] - iVar26;
            auVar39._8_4_ = local_98[2] - iVar26;
            auVar39._12_4_ = local_98[3] - iVar26;
            in_XMM6 = pmovzxbd(in_XMM6,puVar25[iVar27]);
            auVar39 = pmulld(auVar39,auVar31);
            auVar32._4_4_ = iVar24;
            auVar32._0_4_ = iVar24;
            auVar32._8_4_ = iVar24;
            auVar32._12_4_ = iVar24;
            auVar35 = pmulld(auVar32,in_XMM6);
            auVar33._0_4_ = auVar35._0_4_ + in_XMM3._0_4_;
            auVar33._4_4_ = auVar35._4_4_ + iVar36;
            auVar33._8_4_ = auVar35._8_4_ + iVar37;
            auVar33._12_4_ = auVar35._12_4_ + iVar38;
            auVar35 = pmulld(auVar33,in_XMM4);
            auVar31._0_4_ = (uint)(auVar35._0_4_ + auVar39._0_4_) >> 8;
            auVar31._4_4_ = (uint)(auVar35._4_4_ + auVar39._4_4_) >> 8;
            auVar31._8_4_ = (uint)(auVar35._8_4_ + auVar39._8_4_) >> 8;
            auVar31._12_4_ = (uint)(auVar35._12_4_ + auVar39._12_4_) >> 8;
          }
          auVar34._0_4_ = auVar31._0_4_ >> 0xe;
          auVar34._4_4_ = auVar31._4_4_ >> 0xe;
          auVar34._8_4_ = auVar31._8_4_ >> 0xe;
          auVar34._12_4_ = auVar31._12_4_ >> 0xe;
          auVar35 = packusdw(auVar34,auVar34);
          sVar8 = auVar35._0_2_;
          sVar9 = auVar35._2_2_;
          sVar10 = auVar35._4_2_;
          sVar11 = auVar35._6_2_;
          in_XMM2._0_4_ =
               CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar35[6] - (0xff < sVar11),
                        CONCAT12((0 < sVar10) * (sVar10 < 0x100) * auVar35[4] - (0xff < sVar10),
                                 CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar35[2] -
                                          (0xff < sVar9),
                                          (0 < sVar8) * (sVar8 < 0x100) * auVar35[0] -
                                          (0xff < sVar8))));
          sVar12 = auVar35._8_2_;
          in_XMM2[4] = (0 < sVar12) * (sVar12 < 0x100) * auVar35[8] - (0xff < sVar12);
          sVar13 = auVar35._10_2_;
          in_XMM2[5] = (0 < sVar13) * (sVar13 < 0x100) * auVar35[10] - (0xff < sVar13);
          sVar14 = auVar35._12_2_;
          in_XMM2[6] = (0 < sVar14) * (sVar14 < 0x100) * auVar35[0xc] - (0xff < sVar14);
          sVar15 = auVar35._14_2_;
          in_XMM2[7] = (0 < sVar15) * (sVar15 < 0x100) * auVar35[0xe] - (0xff < sVar15);
          in_XMM2[8] = (0 < sVar8) * (sVar8 < 0x100) * auVar35[0] - (0xff < sVar8);
          in_XMM2[9] = (0 < sVar9) * (sVar9 < 0x100) * auVar35[2] - (0xff < sVar9);
          in_XMM2[10] = (0 < sVar10) * (sVar10 < 0x100) * auVar35[4] - (0xff < sVar10);
          in_XMM2[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar35[6] - (0xff < sVar11);
          in_XMM2[0xc] = (0 < sVar12) * (sVar12 < 0x100) * auVar35[8] - (0xff < sVar12);
          in_XMM2[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar35[10] - (0xff < sVar13);
          in_XMM2[0xe] = (0 < sVar14) * (sVar14 < 0x100) * auVar35[0xc] - (0xff < sVar14);
          in_XMM2[0xf] = (0 < sVar15) * (sVar15 < 0x100) * auVar35[0xe] - (0xff < sVar15);
          *puVar28 = in_XMM2._0_4_;
          puVar28 = puVar28 + 1;
          lVar22 = lVar22 + 1;
        } while (lVar22 < *piStack_c0);
      }
      local_118 = local_118 + 1;
    } while (local_118 != (uint)dh);
  }
LAB_005baaaa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qt_qimageScaleAARGBA_up_x_down_y_sse4(QImageScaleInfo *isi, unsigned int *dest,
                                           int dw, int dh, int dow, int sow)
{
    const unsigned int **ypoints = isi->ypoints;
    const int *xpoints = isi->xpoints;
    const int *xapoints = isi->xapoints;
    const int *yapoints = isi->yapoints;

    const __m128i v256 = _mm_set1_epi32(256);

    /* go through every scanline in the output buffer */
    auto scaleSection = [&] (int yStart, int yEnd) {
        for (int y = yStart; y < yEnd; ++y) {
            const int Cy = yapoints[y] >> 16;
            const int yap = yapoints[y] & 0xffff;
            const __m128i vCy = _mm_set1_epi32(Cy);
            const __m128i vyap = _mm_set1_epi32(yap);

            unsigned int *dptr = dest + (y * dow);
            for (int x = 0; x < dw; x++) {
                const unsigned int *sptr = ypoints[y] + xpoints[x];
                __m128i vx = qt_qimageScaleAARGBA_helper(sptr, yap, Cy, sow, vyap, vCy);

                const int xap = xapoints[x];
                if (xap > 0) {
                    const __m128i vxap = _mm_set1_epi32(xap);
                    const __m128i vinvxap = _mm_sub_epi32(v256, vxap);
                    __m128i vr = qt_qimageScaleAARGBA_helper(sptr + 1, yap, Cy, sow, vyap, vCy);

                    vx = _mm_mullo_epi32(vx, vinvxap);
                    vr = _mm_mullo_epi32(vr, vxap);
                    vx = _mm_add_epi32(vx, vr);
                    vx = _mm_srli_epi32(vx, 8);
                }
                vx = _mm_srli_epi32(vx, 14);
                vx = _mm_packus_epi32(vx, vx);
                vx = _mm_packus_epi16(vx, vx);
                *dptr = _mm_cvtsi128_si32(vx);
                if (RGB)
                    *dptr |= 0xff000000;
                dptr++;
            }
        }
    };
    multithread_pixels_function(isi, dh, scaleSection);
}